

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O3

VkVertexInputRate Diligent::LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)

{
  VkVertexInputRate VVar1;
  int iVar2;
  undefined7 in_register_00000039;
  string msg;
  string local_30;
  
  iVar2 = (int)CONCAT71(in_register_00000039,frequency);
  if (iVar2 == 2) {
    VVar1 = VK_VERTEX_INPUT_RATE_INSTANCE;
  }
  else {
    VVar1 = VK_VERTEX_INPUT_RATE_VERTEX;
    if (iVar2 != 1) {
      if (iVar2 == 0) {
        FormatString<char[35]>(&local_30,(char (*) [35])"Undefined layout element frequency");
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"LayoutElemFrequencyToVkInputRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x3dc);
      }
      else {
        FormatString<char[33]>(&local_30,(char (*) [33])"Unknown layout element frequency");
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"LayoutElemFrequencyToVkInputRate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
                   ,0x3e3);
      }
      VVar1 = VK_VERTEX_INPUT_RATE_VERTEX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return VVar1;
}

Assistant:

VkVertexInputRate LayoutElemFrequencyToVkInputRate(INPUT_ELEMENT_FREQUENCY frequency)
{
    switch (frequency)
    {
        case INPUT_ELEMENT_FREQUENCY_UNDEFINED:
            UNEXPECTED("Undefined layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;

        case INPUT_ELEMENT_FREQUENCY_PER_VERTEX: return VK_VERTEX_INPUT_RATE_VERTEX;
        case INPUT_ELEMENT_FREQUENCY_PER_INSTANCE: return VK_VERTEX_INPUT_RATE_INSTANCE;

        default:
            UNEXPECTED("Unknown layout element frequency");
            return VK_VERTEX_INPUT_RATE_VERTEX;
    }
}